

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileiconprovider.cpp
# Opt level: O2

QIcon __thiscall
QAbstractFileIconProviderPrivate::getIconThemeIcon
          (QAbstractFileIconProviderPrivate *this,QFileInfo *info)

{
  char cVar1;
  IconType type;
  long in_FS_OFFSET;
  QMimeType aQStack_48 [8];
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  QFileInfo *pQVar2;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = info;
  cVar1 = QFileInfo::isRoot();
  type = (IconType)pQVar2;
  if (cVar1 == '\0') {
    cVar1 = QFileInfo::isDir();
    if (cVar1 == '\0') {
      QMimeDatabase::mimeTypeForFile(aQStack_48,info + 0x18);
      QMimeType::iconName();
      QIcon::fromTheme((QIcon *)this,(QString *)&local_40);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
      QMimeType::~QMimeType(aQStack_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return (QIcon)(QIconPrivate *)this;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) goto LAB_00251950;
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
LAB_00251950:
    getIconThemeIcon(this,type);
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QAbstractFileIconProviderPrivate::getIconThemeIcon(const QFileInfo &info) const
{
    if (info.isRoot())
        return getIconThemeIcon(QAbstractFileIconProvider::Drive);
    if (info.isDir())
        return getIconThemeIcon(QAbstractFileIconProvider::Folder);
#if QT_CONFIG(mimetype)
    return QIcon::fromTheme(mimeDatabase.mimeTypeForFile(info).iconName());
#else
    return QIcon::fromTheme("text-x-generic"_L1);
#endif
}